

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player_cycle_2.h
# Opt level: O0

void __thiscall PlayerCycle_2::PlayerCycle_2(PlayerCycle_2 *this,string *name)

{
  int iVar1;
  Player *in_RSI;
  string *in_RDI;
  
  Player::Player(in_RSI,in_RDI);
  *(undefined ***)in_RDI = &PTR__PlayerCycle_2_0011b900;
  iVar1 = rand();
  *(int *)(in_RDI + 0x28) = iVar1 % 3;
  iVar1 = rand();
  *(int *)(in_RDI + 0x2c) = iVar1 % 2;
  return;
}

Assistant:

PlayerCycle_2(const std::string& name) :
      Player(name),
      m_play(rand()%3),
      m_up(rand()%2)
   {}